

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O2

void display_player(wchar_t mode)

{
  ushort uVar1;
  wchar_t y;
  ui_entry *puVar2;
  _Bool _Var3;
  byte bVar4;
  wchar_t wVar5;
  wchar_t c;
  wchar_t wVar6;
  panel *p;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  void *pvVar9;
  cached_object_data **ppcVar10;
  object *poVar11;
  ulong uVar12;
  player *ppVar13;
  long lVar14;
  wchar_t a;
  long lVar15;
  wchar_t i;
  wchar_t slot;
  ulong uVar16;
  char_sheet_config *pcVar17;
  wchar_t *pwVar18;
  cached_object_data **ppcVar19;
  wchar_t *pwVar20;
  cached_player_data *pcache;
  char_sheet_config *local_70;
  ui_entry_details local_64;
  long local_40;
  long local_38;
  
  _Var3 = have_valid_char_sheet_config();
  if (!_Var3) {
    configure_char_sheet();
  }
  clear_from(L'\0');
  if ((Term == angband_term[0]) || (player->upkeep->playing == true)) {
    display_player_stat_info();
    if (mode == L'\0') {
      display_player_xtra_info();
      return;
    }
    p = get_panel_topleft();
    display_panel(p,true,&panels[0].bounds);
    panel_free(p);
    pcVar17 = cached_config;
    pwVar7 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
    pwVar8 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
    pvVar9 = mem_alloc((ulong)(player->body).count << 3);
    ppcVar10 = (cached_object_data **)mem_zalloc((ulong)(player->body).count << 3);
    pcache = (cached_player_data *)0x0;
    for (uVar16 = 0; uVar16 < (player->body).count; uVar16 = uVar16 + 1) {
      poVar11 = slot_object(player,(wchar_t)uVar16);
      *(object **)((long)pvVar9 + uVar16 * 8) = poVar11;
    }
    c_put_str('\x01',"abcdefgimnop@",L'\x01',L'\x1a');
    local_64.label_position.x = (uint)(player->body).count + L'\x1f';
    local_64.value_position.x = L'\x1a';
    local_64.position_step = (loc)loc(1,0);
    local_64.combined_position = (loc)loc(0,0);
    local_64.vertical_label = false;
    local_64.alternate_color_first = false;
    local_64.known_rune = true;
    local_64.show_combined = false;
    for (lVar15 = 0; lVar15 < pcVar17->n_stat_mod_entries; lVar15 = lVar15 + 1) {
      puVar2 = pcVar17->stat_mod_entries[lVar15];
      uVar16 = 0;
      ppcVar19 = ppcVar10;
      pwVar18 = pwVar7;
      pwVar20 = pwVar8;
      while( true ) {
        uVar1 = (player->body).count;
        if (uVar1 <= uVar16) break;
        compute_ui_entry_values_for_object
                  (puVar2,*(object **)((long)pvVar9 + uVar16 * 8),player,ppcVar19,pwVar18,pwVar20);
        uVar16 = uVar16 + 1;
        pwVar20 = pwVar20 + 1;
        pwVar18 = pwVar18 + 1;
        ppcVar19 = ppcVar19 + 1;
      }
      compute_ui_entry_values_for_player(puVar2,player,&pcache,pwVar7 + uVar1,pwVar8 + uVar1);
      pwVar7[(player->body).count] = L'\0';
      local_64.label_position.y = (int)lVar15 + L'\x02';
      local_64.value_position.y = local_64.label_position.y;
      wVar5 = get_ui_entry_renderer_index(puVar2);
      ui_entry_renderer_apply
                (wVar5,(wchar_t *)0x0,L'\0',pwVar7,pwVar8,(uint)(player->body).count + L'\x01',
                 &local_64);
    }
    if (pcache != (cached_player_data *)0x0) {
      release_cached_player_data(pcache);
    }
    ppVar13 = player;
    for (uVar16 = 0; uVar16 < (ppVar13->body).count; uVar16 = uVar16 + 1) {
      if (ppcVar10[uVar16] != (cached_object_data *)0x0) {
        release_cached_object_data(ppcVar10[uVar16]);
        ppVar13 = player;
      }
    }
    mem_free(ppcVar10);
    mem_free(pvVar9);
    mem_free(pwVar8);
    mem_free(pwVar7);
    for (lVar15 = 0; pcVar17 = cached_config, lVar15 != 4; lVar15 = lVar15 + 1) {
      pwVar7 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
      pwVar8 = (wchar_t *)mem_alloc((ulong)(player->body).count * 4 + 4);
      pvVar9 = mem_alloc((ulong)(player->body).count << 3);
      ppcVar10 = (cached_object_data **)mem_zalloc((ulong)(player->body).count << 3);
      pcache = (cached_player_data *)0x0;
      wVar5 = pcVar17->res_regions[lVar15].col;
      local_70 = pcVar17;
      y = pcVar17->res_regions[lVar15].row;
      uVar16 = 0;
      while( true ) {
        uVar12 = (ulong)(player->body).count;
        if (uVar12 <= uVar16) break;
        poVar11 = slot_object(player,(wchar_t)uVar16);
        *(object **)((long)pvVar9 + uVar16 * 8) = poVar11;
        uVar16 = uVar16 + 1;
      }
      wVar6 = local_70->res_nlabel;
      local_40 = lVar15;
      for (slot = L'\0'; pcVar17 = local_70, (uint)slot < (uint)(wchar_t)uVar12;
          slot = slot + L'\x01') {
        poVar11 = slot_object(player,slot);
        c = L' ';
        a = L'\x01';
        if (((poVar11 != (object *)0x0) && (c = L' ', a = L'\x01', tile_width == '\x01')) &&
           (tile_height == '\x01')) {
          bVar4 = object_attr(poVar11);
          c = object_char(poVar11);
          a = (wchar_t)bVar4;
        }
        Term_putch(wVar6 + wVar5 + slot,y,a,c);
        uVar12 = (ulong)(player->body).count;
      }
      wVar6 = y + L'\x02';
      Term_putstr(wVar5,y + L'\x01',local_70->res_cols,L'\x01',"      abcdefgimnop@");
      local_64.value_position.x = wVar5 + pcVar17->res_nlabel;
      local_64.label_position.x = wVar5;
      local_64.position_step = (loc)loc(1,0);
      local_64.combined_position = (loc)loc(0,0);
      local_64._32_4_ = ((uint)local_64._32_4_ >> 0x10 & 0xff) << 0x10;
      lVar15 = local_40;
      for (lVar14 = 0; lVar14 < pcVar17->n_resist_by_region[lVar15]; lVar14 = lVar14 + 1) {
        local_38 = lVar14 * 0x20;
        puVar2 = pcVar17->resists_by_region[lVar15][lVar14].entry;
        uVar16 = 0;
        pwVar18 = pwVar7;
        pwVar20 = pwVar8;
        ppcVar19 = ppcVar10;
        while( true ) {
          uVar1 = (player->body).count;
          if (uVar1 <= uVar16) break;
          compute_ui_entry_values_for_object
                    (puVar2,*(object **)((long)pvVar9 + uVar16 * 8),player,ppcVar19,pwVar18,pwVar20)
          ;
          uVar16 = uVar16 + 1;
          pwVar20 = pwVar20 + 1;
          pwVar18 = pwVar18 + 1;
          ppcVar19 = ppcVar19 + 1;
        }
        compute_ui_entry_values_for_player(puVar2,player,&pcache,pwVar7 + uVar1,pwVar8 + uVar1);
        local_64.label_position.y = wVar6;
        local_64.value_position.y = wVar6;
        _Var3 = is_ui_entry_for_known_rune(puVar2,player);
        local_64.known_rune = _Var3;
        wVar5 = get_ui_entry_renderer_index(puVar2);
        lVar15 = local_40;
        pcVar17 = local_70;
        ui_entry_renderer_apply
                  (wVar5,(wchar_t *)((long)local_70->resists_by_region[local_40]->label + local_38),
                   local_70->res_nlabel,pwVar7,pwVar8,(uint)(player->body).count + L'\x01',&local_64
                  );
        wVar6 = wVar6 + L'\x01';
      }
      if (pcache != (cached_player_data *)0x0) {
        release_cached_player_data(pcache);
      }
      ppVar13 = player;
      for (uVar16 = 0; uVar16 < (ppVar13->body).count; uVar16 = uVar16 + 1) {
        if (ppcVar10[uVar16] != (cached_object_data *)0x0) {
          release_cached_object_data(ppcVar10[uVar16]);
          ppVar13 = player;
        }
      }
      mem_free(ppcVar10);
      mem_free(pvVar9);
      mem_free(pwVar8);
      mem_free(pwVar7);
    }
  }
  return;
}

Assistant:

void display_player(int mode)
{
	if (!have_valid_char_sheet_config()) {
		configure_char_sheet();
	}

	/* Erase screen */
	clear_from(0);

	/* When not playing, do not display in subwindows */
	if (Term != angband_term[0] && !player->upkeep->playing) return;

	/* Stat info */
	display_player_stat_info();

	if (mode) {
		struct panel *p = panels[0].panel();
		display_panel(p, panels[0].align_left, &panels[0].bounds);
		panel_free(p);

		/* Stat/Sustain flags */
		display_player_sust_info(cached_config);

		/* Other flags */
		display_player_flag_info();
	} else {
		/* Extra info */
		display_player_xtra_info();
	}
}